

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListView.cpp
# Opt level: O2

void __thiscall
QColorListView::setSelectedColorNames(QColorListView *this,QStringList *colorListNames)

{
  QColorListModel *pQVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  int iVar5;
  QSet<QString> colors;
  QItemSelection selection;
  QForeachContainer<QList<QString>_> _container_82;
  QString colorName;
  QModelIndex index;
  
  colors.q_hash.d = (Hash)(Data *)0x0;
  selection.super_QList<QItemSelectionRange>.d.d = (Data *)0x0;
  selection.super_QList<QItemSelectionRange>.d.ptr = (QItemSelectionRange *)0x0;
  selection.super_QList<QItemSelectionRange>.d.size = 0;
  QtPrivate::QForeachContainer<QList<QString>_>::QForeachContainer(&_container_82,colorListNames);
  for (; _container_82.i.i != _container_82.e.i; _container_82.i.i = _container_82.i.i + 1) {
    QColor::setNamedColor((QString *)&colorName);
    QColor::name((NameFormat)&index);
    QSet<QString>::operator<<(&colors,(QString *)&index);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&index);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&_container_82);
  iVar5 = 0;
  while( true ) {
    pQVar1 = this->d->model;
    _container_82.c.d.d = (Data *)0xffffffffffffffff;
    _container_82.c.d.ptr = (QString *)0x0;
    _container_82.c.d.size = 0;
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&_container_82);
    if (iVar3 <= iVar5) break;
    pQVar1 = this->d->model;
    _container_82.c.d.d = (Data *)0xffffffffffffffff;
    _container_82.c.d.ptr = (QString *)0x0;
    _container_82.c.d.size = 0;
    (**(code **)(*(long *)pQVar1 + 0x60))(&index,pQVar1,iVar5,0,&_container_82);
    QModelIndex::data((QVariant *)&_container_82,&index,0x100);
    QVariant::toString();
    QVariant::~QVariant((QVariant *)&_container_82);
    bVar2 = QHash<QString,_QHashDummyValue>::contains(&colors.q_hash,(QString *)&colorName.d);
    if (bVar2) {
      QItemSelection::select((QModelIndex *)&selection,&index);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&colorName.d);
    iVar5 = iVar5 + 1;
  }
  plVar4 = (long *)QAbstractItemView::selectionModel();
  (**(code **)(*plVar4 + 0x70))(plVar4,&selection,3);
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
            ((QArrayDataPointer<QItemSelectionRange> *)&selection);
  QHash<QString,_QHashDummyValue>::~QHash(&colors.q_hash);
  return;
}

Assistant:

void QColorListView::setSelectedColorNames(const QStringList &colorListNames) {
    QSet<QString> colors;
    QItemSelection selection;

    foreach (const QString &colorName, colorListNames) {
        colors << d->internalColorName(QColor(colorName));
    }

    for (int i = 0; i < d->model->rowCount(); i++) {
        const QModelIndex index = d->model->index(i, 0);
        const QString colorName = index.data(static_cast<int>(QColorListModel::Role::HexArgbName)).toString();

        if (colors.contains(colorName)) {
            selection.select(index, index);
        }
    }

    selectionModel()->select(selection, QItemSelectionModel::ClearAndSelect);
}